

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O1

void __thiscall
CaDiCaL::Internal::analyze_literal
          (Internal *this,int lit,int *open,int *resolvent_size,int *antecedent_size)

{
  int iVar1;
  int iVar2;
  pointer pFVar3;
  iterator iVar4;
  pointer pLVar5;
  iterator __position;
  uint uVar6;
  Clause *pCVar7;
  pointer pVVar8;
  uint64_t id;
  uint local_44;
  unsigned_long local_40;
  int *local_38;
  
  uVar6 = lit;
  if (lit < 1) {
    uVar6 = -lit;
  }
  pVVar8 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar3 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_44 = lit;
  if (pVVar8[uVar6].level == 0) {
LAB_0080625b:
    if ((((uint)pFVar3[uVar6] & 1) == 0) && (this->lrat == true)) {
      pFVar3[uVar6] = (Flags)((uint)pFVar3[uVar6] | 1);
      iVar4._M_current =
           (this->unit_analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->unit_analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->unit_analyzed,iVar4,(int *)&local_44);
      }
      else {
        *iVar4._M_current = local_44;
        (this->unit_analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      uVar6 = local_44;
      if ((int)local_44 < 1) {
        uVar6 = -local_44;
      }
      local_40 = (this->unit_clauses_idx).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)(uVar6 << 1 | -local_44 >> 0x1f)];
      __position._M_current =
           (this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->unit_chain,
                   __position,&local_40);
      }
      else {
        *__position._M_current = local_40;
        (this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
  }
  else {
    *antecedent_size = *antecedent_size + 1;
    if (((uint)pFVar3[uVar6] & 1) != 0) {
      return;
    }
    pVVar8 = pVVar8 + uVar6;
    if (pVVar8->reason == this->external_reason) {
      local_38 = resolvent_size;
      pCVar7 = learn_external_reason_clause(this,-lit,0,true);
      pVVar8->reason = pCVar7;
      resolvent_size = local_38;
      if (pCVar7 == (Clause *)0x0) {
        *antecedent_size = *antecedent_size + -1;
        goto LAB_0080625b;
      }
    }
    *(byte *)(pFVar3 + uVar6) = *(byte *)(pFVar3 + uVar6) | 1;
    iVar4._M_current =
         (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->analyzed,iVar4,(int *)&local_44);
    }
    else {
      *iVar4._M_current = local_44;
      (this->analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = iVar4._M_current + 1;
    }
    if (pVVar8->level < this->level) {
      iVar4._M_current =
           (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->clause,iVar4,(int *)&local_44);
      }
      else {
        *iVar4._M_current = local_44;
        (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar4._M_current + 1;
      }
    }
    iVar1 = pVVar8->level;
    pLVar5 = (this->control).super__Vector_base<CaDiCaL::Level,_std::allocator<CaDiCaL::Level>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar2 = pLVar5[iVar1].seen.count;
    pLVar5[iVar1].seen.count = iVar2 + 1;
    if (iVar2 == 0) {
      iVar4._M_current =
           (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->levels,iVar4,&pVVar8->level);
      }
      else {
        *iVar4._M_current = pVVar8->level;
        (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar4._M_current + 1;
      }
    }
    if (pVVar8->trail < pLVar5[iVar1].seen.trail) {
      pLVar5[iVar1].seen.trail = pVVar8->trail;
    }
    *resolvent_size = *resolvent_size + 1;
    if (pVVar8->level == this->level) {
      *open = *open + 1;
    }
  }
  return;
}

Assistant:

inline void Internal::analyze_literal (int lit, int &open,
                                       int &resolvent_size,
                                       int &antecedent_size) {
  assert (lit);
  Var &v = var (lit);
  Flags &f = flags (lit);

  if (!v.level) {
    if (f.seen || !lrat)
      return;
    f.seen = true;
    unit_analyzed.push_back (lit);
    assert (val (lit) < 0);
    const unsigned uidx = vlit (-lit);
    uint64_t id = unit_clauses (uidx);
    assert (id);
    unit_chain.push_back (id);
    return;
  }
  ++antecedent_size;
  if (f.seen)
    return;

  // before marking as seen, get reason and check for missed unit

  assert (val (lit) < 0);
  assert (v.level <= level);
  if (v.reason == external_reason) {
    assert (!opts.exteagerreasons);
    v.reason = learn_external_reason_clause (-lit, 0, true);
    if (!v.reason) { // actually a unit
      --antecedent_size;
      LOG ("%d unit after explanation", -lit);
      if (f.seen || !lrat)
        return;
      f.seen = true;
      unit_analyzed.push_back (lit);
      assert (val (lit) < 0);
      const unsigned uidx = vlit (-lit);
      uint64_t id = unit_clauses (uidx);
      assert (id);
      unit_chain.push_back (id);
      return;
    }
  }

  f.seen = true;
  analyzed.push_back (lit);

  assert (v.reason != external_reason);
  if (v.level < level)
    clause.push_back (lit);
  Level &l = control[v.level];
  if (!l.seen.count++) {
    LOG ("found new level %d contributing to conflict", v.level);
    levels.push_back (v.level);
  }
  if (v.trail < l.seen.trail)
    l.seen.trail = v.trail;
  ++resolvent_size;
  LOG ("analyzed literal %d assigned at level %d", lit, v.level);
  if (v.level == level)
    open++;
}